

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

char * deqp::gls::RandomArrayGenerator::generatePerQuad
                 (int seed,int count,int componentCount,int stride,Primitive primitive,
                 InputType type,GLValue min,GLValue max)

{
  undefined1 min_00;
  undefined2 min_01;
  undefined1 max_00;
  undefined2 max_01;
  char *local_28;
  char *data;
  InputType type_local;
  Primitive primitive_local;
  int stride_local;
  int componentCount_local;
  int count_local;
  int seed_local;
  
  local_28 = (char *)0x0;
  min_00 = min.field_1.b.m_value;
  min_01 = min.field_1.s.m_value;
  max_00 = max.field_1.b.m_value;
  max_01 = max.field_1.s.m_value;
  switch(type) {
  case INPUTTYPE_FLOAT:
    local_28 = createPerQuads<deqp::gls::GLValue::WrappedFloatType<float>>
                         (seed,count,componentCount,stride,primitive,min.field_1.fl.m_value,
                          max.field_1.fl.m_value);
    break;
  case INPUTTYPE_FIXED:
    local_28 = createPerQuads<deqp::gls::GLValue::Fixed>
                         (seed,count,componentCount,stride,primitive,min.field_1.fi.m_value,
                          max.field_1.fi.m_value);
    break;
  case INPUTTYPE_DOUBLE:
    local_28 = createPerQuads<deqp::gls::GLValue::WrappedFloatType<double>>
                         (seed,count,componentCount,stride,primitive,min.field_1.d.m_value,
                          max.field_1.d.m_value);
    break;
  case INPUTTYPE_BYTE:
    local_28 = createPerQuads<deqp::gls::GLValue::WrappedType<signed_char>>
                         (seed,count,componentCount,stride,primitive,
                          (WrappedType<signed_char>)min_00,(WrappedType<signed_char>)max_00);
    break;
  case INPUTTYPE_SHORT:
    local_28 = createPerQuads<deqp::gls::GLValue::WrappedType<short>>
                         (seed,count,componentCount,stride,primitive,(WrappedType<short>)min_01,
                          (WrappedType<short>)max_01);
    break;
  case INPUTTYPE_UNSIGNED_BYTE:
    local_28 = createPerQuads<deqp::gls::GLValue::WrappedType<unsigned_char>>
                         (seed,count,componentCount,stride,primitive,
                          (WrappedType<unsigned_char>)min_00,(WrappedType<unsigned_char>)max_00);
    break;
  case INPUTTYPE_UNSIGNED_SHORT:
    local_28 = createPerQuads<deqp::gls::GLValue::WrappedType<unsigned_short>>
                         (seed,count,componentCount,stride,primitive,
                          (WrappedType<unsigned_short>)min_01,(WrappedType<unsigned_short>)max_01);
    break;
  case INPUTTYPE_INT:
    local_28 = createPerQuads<deqp::gls::GLValue::WrappedType<int>>
                         (seed,count,componentCount,stride,primitive,
                          (WrappedType<int>)min.field_1.fl.m_value,
                          (WrappedType<int>)max.field_1.fl.m_value);
    break;
  case INPUTTYPE_UNSIGNED_INT:
    local_28 = createPerQuads<deqp::gls::GLValue::WrappedType<unsigned_int>>
                         (seed,count,componentCount,stride,primitive,
                          (WrappedType<unsigned_int>)min.field_1.fl.m_value,
                          (WrappedType<unsigned_int>)max.field_1.fl.m_value);
    break;
  case INPUTTYPE_HALF:
    local_28 = createPerQuads<deqp::gls::GLValue::Half>
                         (seed,count,componentCount,stride,primitive,(Half)min_01,(Half)max_01);
  }
  return local_28;
}

Assistant:

char* RandomArrayGenerator::generatePerQuad (int seed, int count, int componentCount, int stride, Array::Primitive primitive, Array::InputType type, GLValue min, GLValue max)
{
	char* data = DE_NULL;

	switch (type)
	{
		case Array::INPUTTYPE_FLOAT:
			data = createPerQuads<GLValue::Float>(seed, count, componentCount, stride, primitive, min.fl, max.fl);
			break;

		case Array::INPUTTYPE_FIXED:
			data = createPerQuads<GLValue::Fixed>(seed, count, componentCount, stride, primitive, min.fi, max.fi);
			break;

		case Array::INPUTTYPE_DOUBLE:
			data = createPerQuads<GLValue::Double>(seed, count, componentCount, stride, primitive, min.d, max.d);
			break;

		case Array::INPUTTYPE_BYTE:
			data = createPerQuads<GLValue::Byte>(seed, count, componentCount, stride, primitive, min.b, max.b);
			break;

		case Array::INPUTTYPE_SHORT:
			data = createPerQuads<GLValue::Short>(seed, count, componentCount, stride, primitive, min.s, max.s);
			break;

		case Array::INPUTTYPE_UNSIGNED_BYTE:
			data = createPerQuads<GLValue::Ubyte>(seed, count, componentCount, stride, primitive, min.ub, max.ub);
			break;

		case Array::INPUTTYPE_UNSIGNED_SHORT:
			data = createPerQuads<GLValue::Ushort>(seed, count, componentCount, stride, primitive, min.us, max.us);
			break;

		case Array::INPUTTYPE_UNSIGNED_INT:
			data = createPerQuads<GLValue::Uint>(seed, count, componentCount, stride, primitive, min.ui, max.ui);
			break;

		case Array::INPUTTYPE_INT:
			data = createPerQuads<GLValue::Int>(seed, count, componentCount, stride, primitive, min.i, max.i);
			break;

		case Array::INPUTTYPE_HALF:
			data = createPerQuads<GLValue::Half>(seed, count, componentCount, stride, primitive, min.h, max.h);
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	return data;
}